

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WriteDumb.cpp
# Opt level: O0

void ConvertName(aiString *out,aiString *in)

{
  char cVar1;
  uint uVar2;
  uint local_1c;
  uint i;
  aiString *in_local;
  aiString *out_local;
  
  out->length = 0;
  for (local_1c = 0; local_1c < in->length; local_1c = local_1c + 1) {
    switch(in->data[local_1c]) {
    case '\"':
      aiString::Append(out,"&quot;");
      break;
    default:
      cVar1 = in->data[local_1c];
      uVar2 = out->length;
      out->length = uVar2 + 1;
      out->data[uVar2] = cVar1;
      break;
    case '&':
      aiString::Append(out,"&amp;");
      break;
    case '\'':
      aiString::Append(out,"&apos;");
      break;
    case '<':
      aiString::Append(out,"&lt;");
      break;
    case '>':
      aiString::Append(out,"&gt;");
    }
  }
  out->data[out->length] = '\0';
  return;
}

Assistant:

void ConvertName(aiString& out, const aiString& in)
{
	out.length = 0;
	for (unsigned int i = 0; i < in.length; ++i)  {
		switch (in.data[i]) {
			case '<':
				out.Append("&lt;");break;
			case '>':
				out.Append("&gt;");break;
			case '&':
				out.Append("&amp;");break;
			case '\"':
				out.Append("&quot;");break;
			case '\'':
				out.Append("&apos;");break;
			default:
				out.data[out.length++] = in.data[i];
		}
	}
	out.data[out.length] = 0;
}